

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

void __thiscall cppwinrt::writer::add_depends(writer *this,TypeDef *type)

{
  bool bVar1;
  _Rb_tree<winmd::reader::TypeDef,winmd::reader::TypeDef,std::_Identity<winmd::reader::TypeDef>,cppwinrt::writer::depends_compare,std::allocator<winmd::reader::TypeDef>>
  *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view ns;
  string_view local_20;
  
  local_20 = winmd::reader::TypeDef::TypeNamespace(type);
  __y._M_str = (this->type_namespace)._M_dataplus._M_p;
  __y._M_len = (this->type_namespace)._M_string_length;
  bVar1 = std::operator!=(local_20,__y);
  if (bVar1) {
    this_00 = (_Rb_tree<winmd::reader::TypeDef,winmd::reader::TypeDef,std::_Identity<winmd::reader::TypeDef>,cppwinrt::writer::depends_compare,std::allocator<winmd::reader::TypeDef>>
               *)std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                 ::operator[](&this->depends,&local_20);
    std::
    _Rb_tree<winmd::reader::TypeDef,winmd::reader::TypeDef,std::_Identity<winmd::reader::TypeDef>,cppwinrt::writer::depends_compare,std::allocator<winmd::reader::TypeDef>>
    ::_M_insert_unique<winmd::reader::TypeDef_const&>(this_00,type);
  }
  return;
}

Assistant:

void add_depends(TypeDef const& type)
        {
            auto ns = type.TypeNamespace();

            if (ns != type_namespace)
            {
                depends[ns].insert(type);
            }
        }